

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  bool bVar1;
  ImVec2 pos;
  float in_EDX;
  ImVec2 in_RSI;
  float _x;
  ImVec2 IVar2;
  ImU32 text_col;
  ImU32 bg_col;
  float value_x2;
  ImU32 frame_col;
  bool popup_open;
  ImGuiID popup_id;
  bool pressed;
  bool held;
  bool hovered;
  ImRect total_bb;
  ImRect bb;
  float w;
  float preview_width;
  ImVec2 label_size;
  float arrow_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiNextWindowDataFlags backup_next_window_data_flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe74;
  undefined8 in_stack_fffffffffffffe78;
  ImDrawList *in_stack_fffffffffffffe80;
  ImRect *in_stack_fffffffffffffe88;
  ImDrawList *p_min;
  undefined4 in_stack_fffffffffffffe90;
  ImGuiID in_stack_fffffffffffffe94;
  undefined4 uVar3;
  ImDrawList *in_stack_fffffffffffffe98;
  ImGuiWindow *in_stack_fffffffffffffea0;
  ImVec2 *this;
  undefined1 hide_text_after_hash;
  undefined4 in_stack_fffffffffffffeb0;
  ImVec2 *this_00;
  ImVec2 p_max;
  ImVec2 p_min_00;
  float in_stack_fffffffffffffed8;
  float fVar4;
  float fVar5;
  float flags_00;
  ImVec2 in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffefc;
  ImRect *in_stack_ffffffffffffff00;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_d4;
  ImVec2 local_cc;
  ImU32 local_c4;
  ImU32 local_c0;
  ImVec2 local_bc;
  float local_b4;
  ImU32 local_b0;
  bool local_a9;
  ImGuiID local_a8;
  byte local_a3;
  undefined1 local_a1;
  ImVec2 local_a0;
  float scale;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  ImVec2 in_stack_ffffffffffffff78;
  ImVec2 in_stack_ffffffffffffff80;
  ImVec2 local_78;
  undefined1 local_70 [8];
  float local_68;
  float fStack_64;
  float local_60;
  ImVec2 local_5c;
  float local_54;
  ImVec2 local_50;
  float local_48;
  float local_44;
  ImVec2 local_40;
  float local_34;
  ImVec2 local_30;
  ImVec2 local_28;
  float local_1c;
  ImVec2 local_18;
  bool local_1;
  
  local_28 = (ImVec2)GImGui;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_30 = (ImVec2)GetCurrentWindow();
  local_34 = (float)((ImGuiNextWindowData *)((long)local_28 + 0x4a88))->Flags;
  ImGuiNextWindowData::ClearFlags((ImGuiNextWindowData *)((long)local_28 + 0x4a88));
  if ((*(bool *)((long)local_30 + 0xcf) & 1U) == 0) {
    local_40 = (ImVec2)((long)local_28 + 0x3900);
    local_44 = (float)ImGuiWindow::GetID(in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98
                                         ,(char *)CONCAT44(in_stack_fffffffffffffe94,
                                                           in_stack_fffffffffffffe90));
    if (((uint)local_1c & 0x20) == 0) {
      flags_00 = GetFrameHeight();
    }
    else {
      flags_00 = 0.0;
    }
    local_48 = flags_00;
    local_50 = CalcTextSize((char *)in_stack_fffffffffffffe98,
                            (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            SUB81((ulong)in_stack_fffffffffffffe88 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffe88,0));
    if ((((uint)local_1c & 0x80) == 0) || (local_18 == (ImVec2)0x0)) {
      fVar5 = 0.0;
    }
    else {
      local_5c = CalcTextSize((char *)in_stack_fffffffffffffe98,
                              (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              SUB81((ulong)in_stack_fffffffffffffe88 >> 0x38,0),
                              SUB84(in_stack_fffffffffffffe88,0));
      fVar5 = local_5c.x;
    }
    fVar4 = local_48;
    local_54 = fVar5;
    if (((uint)local_1c & 0x40) == 0) {
      if (((uint)local_1c & 0x80) == 0) {
        in_stack_fffffffffffffed8 = CalcItemWidth();
        fVar4 = in_stack_fffffffffffffed8;
      }
      else {
        fVar4 = ((ImVec2 *)((long)local_40 + 0x3c))->x;
        in_stack_fffffffffffffed8 = fVar4 + fVar4 + local_48 + fVar5;
        fVar4 = in_stack_fffffffffffffed8;
      }
    }
    pos = (ImVec2)((long)local_30 + 0x118);
    this_00 = (ImVec2 *)&stack0xffffffffffffff80;
    local_60 = fVar4;
    ImVec2::ImVec2(this_00,fVar4,
                   *(float *)((long)local_40 + 0x40) + *(float *)((long)local_40 + 0x40) +
                   local_50.y);
    local_78 = ::operator+(in_stack_fffffffffffffe68,(ImVec2 *)0x2580c7);
    ImRect::ImRect((ImRect *)local_70,(ImVec2 *)pos,&local_78);
    p_max = (ImVec2)local_70;
    p_min_00 = (ImVec2)&local_68;
    if (local_50.x <= 0.0) {
      _x = 0.0;
    }
    else {
      _x = ((ImVec2 *)((long)local_40 + 0x54))->x + local_50.x;
    }
    this = &local_a0;
    ImVec2::ImVec2(this,_x,0.0);
    IVar2 = ::operator+(in_stack_fffffffffffffe68,(ImVec2 *)0x25816c);
    scale = IVar2.y;
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff70,(ImVec2 *)p_max,
                   (ImVec2 *)&stack0xffffffffffffff68);
    ItemSize((ImRect *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (float)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    bVar1 = ItemAdd((ImRect *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                    in_stack_fffffffffffffe88,
                    (ImGuiItemFlags)((ulong)in_stack_fffffffffffffe80 >> 0x20));
    if (bVar1) {
      local_a3 = ButtonBehavior(in_stack_ffffffffffffff00,(ImGuiID)in_stack_fffffffffffffefc,
                                (bool *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                ),(bool *)in_stack_fffffffffffffee8,
                                (ImGuiButtonFlags)flags_00);
      local_a8 = ImHashStr("##ComboPopup",0,(ImGuiID)local_44);
      local_a9 = IsPopupOpen((ImGuiID)in_stack_fffffffffffffe80,
                             (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffe78 >> 0x20));
      if (((local_a3 & 1) != 0) && (!local_a9)) {
        OpenPopupEx((ImGuiID)p_min_00.y,(ImGuiPopupFlags)p_min_00.x);
        local_a9 = true;
      }
      local_b0 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                             SUB84(in_stack_fffffffffffffe80,0));
      local_b4 = ImMax<float>((float)local_70._0_4_,local_68 - local_48);
      RenderNavHighlight((ImRect *)CONCAT44(flags_00,fVar5),(ImGuiID)fVar4,
                         (ImGuiNavHighlightFlags)in_stack_fffffffffffffed8);
      if (((uint)local_1c & 0x40) == 0) {
        in_stack_fffffffffffffe98 = *(ImDrawList **)((long)local_30 + 0x2b0);
        in_stack_fffffffffffffea0 = (ImGuiWindow *)local_70;
        ImVec2::ImVec2(&local_bc,local_b4,fStack_64);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   &in_stack_fffffffffffffe88->Min,(ImVec2 *)in_stack_fffffffffffffe80,
                   (ImU32)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                   (float)in_stack_fffffffffffffe78,(ImDrawFlags)in_stack_fffffffffffffe74);
      }
      if (((uint)local_1c & 0x20) == 0) {
        uVar3 = CONCAT13(1,(int3)in_stack_fffffffffffffe94);
        if ((local_a9 & 1U) == 0) {
          uVar3 = CONCAT13(local_a1,(int3)in_stack_fffffffffffffe94);
        }
        local_c0 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                               SUB84(in_stack_fffffffffffffe80,0));
        local_c4 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                               SUB84(in_stack_fffffffffffffe80,0));
        p_min = *(ImDrawList **)((long)local_30 + 0x2b0);
        ImVec2::ImVec2(&local_cc,local_b4,(float)local_70._4_4_);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(uVar3,in_stack_fffffffffffffe90),(ImVec2 *)p_min,
                   (ImVec2 *)in_stack_fffffffffffffe80,
                   (ImU32)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                   (float)in_stack_fffffffffffffe78,(ImDrawFlags)in_stack_fffffffffffffe74);
        if ((local_b4 + local_48) - ((ImVec2 *)((long)local_40 + 0x3c))->x <= local_68) {
          in_stack_fffffffffffffe80 = *(ImDrawList **)((long)local_30 + 0x2b0);
          ImVec2::ImVec2(&local_d4,local_b4 + *(float *)((long)local_40 + 0x40),
                         (float)local_70._4_4_ + *(float *)((long)local_40 + 0x40));
          RenderArrow((ImDrawList *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,
                      (ImU32)in_stack_ffffffffffffff74,(ImGuiDir)in_stack_ffffffffffffff70,scale);
        }
      }
      RenderFrameBorder(p_min_00,p_max,pos.y);
      if (((uint)local_1c & 0x100000) != 0) {
        ImRect::ImRect((ImRect *)in_stack_fffffffffffffe80,
                       (float)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                       (float)in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                       in_stack_fffffffffffffe70);
        (((ImGuiComboPreviewData *)((long)local_28 + 0x5f7c))->PreviewRect).Min = local_f8;
        *(ImVec2 *)((long)local_28 + 0x5f84) = local_f0;
        local_18.x = 0.0;
        local_18.y = 0.0;
      }
      if ((local_18 != (ImVec2)0x0) && (((uint)local_1c & 0x40) == 0)) {
        if ((*(bool *)((long)local_28 + 0x6138) & 1U) != 0) {
          LogSetNextTextDecoration("{","}");
        }
        ::operator+(in_stack_fffffffffffffe68,(ImVec2 *)0x258615);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffef8,local_b4,fStack_64);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffef0,0.0,0.0);
        RenderTextClipped((ImVec2 *)pos,this_00,(char *)CONCAT44(_x,in_stack_fffffffffffffeb0),
                          (char *)this,(ImVec2 *)in_stack_fffffffffffffea0,
                          (ImVec2 *)in_stack_fffffffffffffe98,(ImRect *)p_min_00);
      }
      hide_text_after_hash = (undefined1)((ulong)this >> 0x38);
      if (0.0 < local_50.x) {
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffee8,
                       local_68 + ((ImVec2 *)((long)local_40 + 0x54))->x,
                       (float)local_70._4_4_ + *(float *)((long)local_40 + 0x40));
        RenderText(pos,(char *)this_00,(char *)CONCAT44(_x,in_stack_fffffffffffffeb0),
                   (bool)hide_text_after_hash);
      }
      if ((local_a9 & 1U) == 0) {
        local_1 = false;
      }
      else {
        ((ImGuiNextWindowData *)((long)local_28 + 0x4a88))->Flags =
             (ImGuiNextWindowDataFlags)local_34;
        local_1 = BeginComboPopup((ImGuiID)in_stack_fffffffffffffef0,
                                  (ImRect *)in_stack_fffffffffffffee8,(ImGuiComboFlags)flags_00);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    ImGuiNextWindowDataFlags backup_next_window_data_flags = g.NextWindowData.Flags;
    g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together
    if (flags & ImGuiComboFlags_WidthFitPreview)
        IM_ASSERT((flags & (ImGuiComboFlags_NoPreview | (ImGuiComboFlags)ImGuiComboFlags_CustomPreview)) == 0);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float preview_width = ((flags & ImGuiComboFlags_WidthFitPreview) && (preview_value != NULL)) ? CalcTextSize(preview_value, NULL, true).x : 0.0f;
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : ((flags & ImGuiComboFlags_WidthFitPreview) ? (arrow_size + preview_width + style.FramePadding.x * 2.0f) : CalcItemWidth());
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(bb.Min, bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &bb))
        return false;

    // Open on click
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    const ImGuiID popup_id = ImHashStr("##ComboPopup", 0, id);
    bool popup_open = IsPopupOpen(popup_id, ImGuiPopupFlags_None);
    if (pressed && !popup_open)
    {
        OpenPopupEx(popup_id, ImGuiPopupFlags_None);
        popup_open = true;
    }

    // Render shape
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(bb.Min.x, bb.Max.x - arrow_size);
    RenderNavHighlight(bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(bb.Min, ImVec2(value_x2, bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersLeft);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, bb.Min.y), bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersRight);
        if (value_x2 + arrow_size - style.FramePadding.x <= bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(bb.Min, bb.Max, style.FrameRounding);

    // Custom preview
    if (flags & ImGuiComboFlags_CustomPreview)
    {
        g.ComboPreviewData.PreviewRect = ImRect(bb.Min.x, bb.Min.y, value_x2, bb.Max.y);
        IM_ASSERT(preview_value == NULL || preview_value[0] == 0);
        preview_value = NULL;
    }

    // Render preview and label
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
    {
        if (g.LogEnabled)
            LogSetNextTextDecoration("{", "}");
        RenderTextClipped(bb.Min + style.FramePadding, ImVec2(value_x2, bb.Max.y), preview_value, NULL, NULL);
    }
    if (label_size.x > 0)
        RenderText(ImVec2(bb.Max.x + style.ItemInnerSpacing.x, bb.Min.y + style.FramePadding.y), label);

    if (!popup_open)
        return false;

    g.NextWindowData.Flags = backup_next_window_data_flags;
    return BeginComboPopup(popup_id, bb, flags);
}